

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

string * phosg::parse_data_string
                   (string *__return_storage_ptr__,string *s,string *mask,uint64_t flags)

{
  size_type sVar1;
  float fVar2;
  ushort uVar3;
  uint uVar4;
  char *pcVar5;
  ulonglong uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  char cVar11;
  ulong uVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong extraout_RDX_16;
  ulong extraout_RDX_17;
  ulong extraout_RDX_18;
  ulong extraout_RDX_19;
  ulong extraout_RDX_20;
  ulong extraout_RDX_21;
  ulong extraout_RDX_22;
  ulong extraout_RDX_23;
  ulong extraout_RDX_24;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  int16_t value;
  string filename;
  byte local_a1;
  char *local_a0;
  byte local_91;
  ulong local_90;
  string local_88;
  undefined8 local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  ulong local_38;
  
  pcVar5 = (s->_M_dataplus)._M_p;
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (mask != (string *)0x0) {
    mask->_M_string_length = 0;
    *(mask->_M_dataplus)._M_p = '\0';
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  cVar11 = *pcVar5;
  uVar12 = CONCAT71((int7)((ulong)mask >> 8),cVar11);
  if (cVar11 != '\0') {
    local_a1 = 1;
    local_90 = 0;
    bVar14 = false;
    local_91 = 1;
    bVar17 = false;
    bVar16 = false;
    bVar13 = false;
    bVar15 = false;
    local_68 = 0;
    local_38 = flags;
    do {
      cVar11 = (char)uVar12;
      if (bVar16) {
        bVar16 = cVar11 != '\n';
LAB_0010cf44:
        local_a0 = pcVar5 + 1;
      }
      else {
        if (bVar17) {
          if ((cVar11 != '*') || (pcVar5[1] != '/')) {
            local_a0 = pcVar5 + 1;
            bVar17 = true;
            bVar16 = false;
            goto LAB_0010d49b;
          }
          local_a0 = pcVar5 + 2;
        }
        else {
          uVar8 = (uint)uVar12;
          if (bVar15) {
            if (cVar11 == '\\') {
              bVar7 = pcVar5[1];
              bVar10 = bVar7;
              if (bVar7 < 0x6e) {
                if (((bVar7 != 0x22) && (bVar7 != 0x27)) && (bVar7 == 0)) break;
              }
              else if (bVar7 == 0x74) {
                bVar10 = 9;
              }
              else {
                bVar10 = 0xd;
                if ((bVar7 != 0x72) && (bVar10 = bVar7, bVar7 == 0x6e)) {
                  bVar10 = 10;
                }
              }
              ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(__return_storage_ptr__,bVar10);
              uVar12 = extraout_RDX_07;
              if (mask != (string *)0x0) {
                ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace_aux(mask,mask->_M_string_length,0,1,-local_a1);
                uVar12 = extraout_RDX_08;
              }
              local_a0 = pcVar5 + 2;
            }
            else {
              if ((uVar8 & 0xff) == 0x22) {
                local_a0 = pcVar5 + 1;
                goto LAB_0010d494;
              }
              ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(__return_storage_ptr__,cVar11);
              uVar12 = extraout_RDX_02;
              if (mask != (string *)0x0) {
                ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace_aux(mask,mask->_M_string_length,0,1,-local_a1);
                uVar12 = extraout_RDX_03;
              }
              local_a0 = pcVar5 + 1;
            }
            bVar15 = true;
          }
          else {
            if (!bVar13) {
              if (bVar14) {
                bVar14 = cVar11 != '>';
                if (cVar11 == '>') {
                  sVar1 = __return_storage_ptr__->_M_string_length;
                  load_file(&local_88,(string *)&local_60);
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::_M_append(__return_storage_ptr__,local_88._M_dataplus._M_p,
                              local_88._M_string_length);
                  uVar12 = extraout_RDX_04;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    local_88.field_2._M_allocated_capacity + 1);
                    uVar12 = extraout_RDX_05;
                  }
                  if (mask != (string *)0x0) {
                    ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                    _M_replace_aux(mask,mask->_M_string_length,0,
                                   __return_storage_ptr__->_M_string_length - sVar1,-local_a1);
                    uVar12 = extraout_RDX_06;
                  }
                }
                else {
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::_M_replace_aux(&local_60,local_60._M_string_length,0,1,cVar11);
                  uVar12 = extraout_RDX_01;
                }
LAB_0010d195:
                local_a0 = pcVar5 + 1;
                bVar15 = false;
                bVar13 = false;
                goto LAB_0010d497;
              }
              uVar4 = uVar8 & 0xff;
              if (uVar4 < 0x25) {
                if (uVar4 == 0x23) {
                  local_a0 = pcVar5 + 1;
                  if (pcVar5[1] == '#') {
                    local_a0 = pcVar5 + 2;
                    if (pcVar5[2] == '#') {
                      local_a0 = pcVar5 + 3;
                      if (pcVar5[3] == '#') {
                        local_a0 = pcVar5 + 4;
                        pcVar5 = (char *)strtoull(local_a0,&local_a0,0);
                        local_88._M_dataplus._M_p =
                             (char *)((ulong)pcVar5 >> 0x38 |
                                      ((ulong)pcVar5 & 0xff000000000000) >> 0x28 |
                                      ((ulong)pcVar5 & 0xff0000000000) >> 0x18 |
                                      ((ulong)pcVar5 & 0xff00000000) >> 8 |
                                      ((ulong)pcVar5 & 0xff000000) << 8 |
                                      ((ulong)pcVar5 & 0xff0000) << 0x18 |
                                      ((ulong)pcVar5 & 0xff00) << 0x28 | (long)pcVar5 << 0x38);
                        if ((local_90 & 1) == 0) {
                          local_88._M_dataplus._M_p = pcVar5;
                        }
                        ::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (__return_storage_ptr__,(char *)&local_88,8);
                        uVar12 = extraout_RDX_09;
                        if (mask != (string *)0x0) {
                          ::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_replace_aux(mask,mask->_M_string_length,0,8,-local_a1);
                          uVar12 = extraout_RDX_10;
                        }
                      }
                      else {
                        uVar6 = strtoull(local_a0,&local_a0,0);
                        uVar4 = (uint)uVar6;
                        uVar8 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                                uVar4 << 0x18;
                        if ((local_90 & 1) == 0) {
                          uVar8 = uVar4;
                        }
                        local_88._M_dataplus._M_p._0_4_ = (float)uVar8;
                        ::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (__return_storage_ptr__,(char *)&local_88,4);
                        uVar12 = extraout_RDX_23;
                        if (mask != (string *)0x0) {
                          ::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_replace_aux(mask,mask->_M_string_length,0,4,-local_a1);
                          uVar12 = extraout_RDX_24;
                        }
                      }
                    }
                    else {
                      uVar6 = strtoull(local_a0,&local_a0,0);
                      uVar3 = (ushort)uVar6;
                      if ((local_90 & 1) != 0) {
                        uVar3 = uVar3 << 8 | uVar3 >> 8;
                      }
                      local_88._M_dataplus._M_p._0_2_ = uVar3;
                      ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (__return_storage_ptr__,(char *)&local_88,2);
                      uVar12 = extraout_RDX_21;
                      if (mask != (string *)0x0) {
                        ::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        _M_replace_aux(mask,mask->_M_string_length,0,2,-local_a1);
                        uVar12 = extraout_RDX_22;
                      }
                    }
                  }
                  else {
                    uVar6 = strtoull(local_a0,&local_a0,0);
                    ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                    _M_replace_aux(__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0
                                   ,1,(char)uVar6);
                    uVar12 = extraout_RDX_13;
                    if (mask != (string *)0x0) {
                      bVar15 = false;
                      ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      _M_replace_aux(mask,mask->_M_string_length,0,1,-local_a1);
                      bVar13 = false;
                      bVar16 = false;
                      bVar17 = false;
                      bVar14 = false;
                      uVar12 = extraout_RDX_14;
                      goto LAB_0010d49b;
                    }
                  }
                }
                else {
                  if (uVar4 != 0x24) goto LAB_0010d223;
                  local_90 = local_90 ^ 1;
LAB_0010d1bb:
                  local_a0 = pcVar5 + 1;
                }
              }
              else if (uVar4 == 0x25) {
                local_a0 = pcVar5 + 1;
                if (pcVar5[1] == '%') {
                  local_a0 = pcVar5 + 2;
                  pcVar5 = (char *)strtod(local_a0,&local_a0);
                  local_88._M_dataplus._M_p =
                       (char *)((ulong)pcVar5 >> 0x38 | ((ulong)pcVar5 & 0xff000000000000) >> 0x28 |
                                ((ulong)pcVar5 & 0xff0000000000) >> 0x18 |
                                ((ulong)pcVar5 & 0xff00000000) >> 8 |
                                ((ulong)pcVar5 & 0xff000000) << 8 |
                                ((ulong)pcVar5 & 0xff0000) << 0x18 |
                                ((ulong)pcVar5 & 0xff00) << 0x28 | (long)pcVar5 << 0x38);
                  if ((local_90 & 1) == 0) {
                    local_88._M_dataplus._M_p = pcVar5;
                  }
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::append(__return_storage_ptr__,(char *)&local_88,8);
                  uVar12 = extraout_RDX_11;
                  if (mask != (string *)0x0) {
                    ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                    _M_replace_aux(mask,mask->_M_string_length,0,8,-local_a1);
                    uVar12 = extraout_RDX_12;
                  }
                }
                else {
                  fVar18 = strtof(local_a0,&local_a0);
                  fVar2 = (float)((uint)fVar18 >> 0x18 | ((uint)fVar18 & 0xff0000) >> 8 |
                                  ((uint)fVar18 & 0xff00) << 8 | (int)fVar18 << 0x18);
                  if ((local_90 & 1) == 0) {
                    fVar2 = fVar18;
                  }
                  local_88._M_dataplus._M_p._0_4_ = fVar2;
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::append(__return_storage_ptr__,(char *)&local_88,4);
                  uVar12 = extraout_RDX_15;
                  if (mask != (string *)0x0) {
                    ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                    _M_replace_aux(mask,mask->_M_string_length,0,4,-local_a1);
                    uVar12 = extraout_RDX_16;
                  }
                }
              }
              else {
                if (uVar4 == 0x3f) {
                  local_a1 = local_a1 ^ 1;
                  goto LAB_0010d1bb;
                }
LAB_0010d223:
                uVar9 = (ulong)(uVar8 - 0x30);
                if (9 < (byte)(uVar8 - 0x30)) {
                  if ((byte)(cVar11 + 0xbfU) < 6) {
                    cVar11 = cVar11 + -0x37;
                  }
                  else {
                    if (5 < (byte)(cVar11 + 0x9fU)) {
                      if (uVar4 < 0x2f) {
                        if (uVar4 == 0x22) {
                          bVar15 = true;
LAB_0010d61c:
                          bVar13 = false;
                        }
                        else {
                          if (uVar4 != 0x27) goto LAB_0010d614;
                          bVar13 = true;
                          bVar15 = false;
                        }
                        bVar16 = false;
                        bVar17 = false;
                      }
                      else {
                        if (uVar4 != 0x2f) {
                          if ((uVar4 == 0x3c) && ((local_38 & 1) != 0)) {
                            local_60._M_string_length = 0;
                            *local_60._M_dataplus._M_p = '\0';
                            bVar14 = true;
                            bVar15 = false;
                            bVar13 = false;
                            bVar16 = false;
                            bVar17 = false;
                            goto LAB_0010cf44;
                          }
LAB_0010d614:
                          bVar15 = false;
                          goto LAB_0010d61c;
                        }
                        bVar16 = pcVar5[1] == '/';
                        bVar17 = pcVar5[1] == '*';
                        bVar15 = false;
                        bVar13 = false;
                      }
                      bVar14 = false;
                      goto LAB_0010cf44;
                    }
                    cVar11 = cVar11 + -0x57;
                  }
                  uVar12 = CONCAT71((int7)(uVar12 >> 8),cVar11);
                  uVar9 = uVar12 & 0xffffffff;
                }
                bVar7 = (byte)uVar9 | (byte)local_68;
                local_a0 = pcVar5 + 1;
                if ((local_91 & 1) == 0) {
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::push_back(__return_storage_ptr__,bVar7);
                  if (mask == (string *)0x0) {
                    local_68 = 0;
                    uVar12 = extraout_RDX_19;
                  }
                  else {
                    local_68 = 0;
                    ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                    _M_replace_aux(mask,mask->_M_string_length,0,1,-local_a1);
                    uVar12 = extraout_RDX_20;
                  }
                }
                else {
                  local_68 = CONCAT71((int7)(uVar9 >> 8),bVar7 << 4);
                }
                local_91 = local_91 ^ 1;
              }
              bVar15 = false;
              bVar13 = false;
              bVar16 = false;
              bVar17 = false;
              bVar14 = false;
              goto LAB_0010d49b;
            }
            if (cVar11 == '\\') {
              bVar7 = pcVar5[1];
              if (bVar7 < 0x72) {
                if (bVar7 == 0x6e) {
                  local_88._M_dataplus._M_p._0_2_ = 10;
                  uVar3 = 10;
                }
                else {
                  if (bVar7 == 0) break;
LAB_0010d43a:
                  uVar3 = (ushort)(char)bVar7;
                  local_88._M_dataplus._M_p._0_2_ = (short)(char)bVar7;
                }
              }
              else if (bVar7 == 0x72) {
                local_88._M_dataplus._M_p._0_2_ = 0xd;
                uVar3 = 0xd;
              }
              else {
                if (bVar7 != 0x74) goto LAB_0010d43a;
                local_88._M_dataplus._M_p._0_2_ = 9;
                uVar3 = 9;
              }
              if ((local_90 & 1) != 0) {
                local_88._M_dataplus._M_p._0_2_ = uVar3 << 8 | uVar3 >> 8;
              }
              ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(__return_storage_ptr__,(char *)&local_88,2);
              uVar12 = extraout_RDX_17;
              if (mask != (string *)0x0) {
                ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace_aux(mask,mask->_M_string_length,0,2,-local_a1);
                uVar12 = extraout_RDX_18;
              }
              local_a0 = pcVar5 + 2;
            }
            else {
              if ((uVar8 & 0xff) == 0x27) goto LAB_0010d195;
              local_88._M_dataplus._M_p._0_2_ = (short)cVar11 << 8 | (ushort)(short)cVar11 >> 8;
              if ((local_90 & 1) == 0) {
                local_88._M_dataplus._M_p._0_2_ = (short)cVar11;
              }
              ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(__return_storage_ptr__,(char *)&local_88,2);
              uVar12 = extraout_RDX;
              if (mask != (string *)0x0) {
                ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace_aux(mask,mask->_M_string_length,0,2,-local_a1);
                uVar12 = extraout_RDX_00;
              }
              local_a0 = pcVar5 + 1;
            }
            bVar13 = true;
LAB_0010d494:
            bVar15 = false;
          }
        }
LAB_0010d497:
        bVar16 = false;
        bVar17 = false;
      }
LAB_0010d49b:
      uVar12 = CONCAT71((int7)(uVar12 >> 8),*local_a0);
      pcVar5 = local_a0;
    } while (*local_a0 != '\0');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string parse_data_string(const string& s, string* mask, uint64_t flags) {
  bool allow_files = flags & ParseDataFlags::ALLOW_FILES;

  const char* in = s.c_str();

  string data;
  if (mask) {
    mask->clear();
  }

#ifdef PHOSG_BIG_ENDIAN
  constexpr bool host_big_endian = true;
#else
  constexpr bool host_big_endian = false;
#endif

  uint8_t chr = 0;
  bool reading_string = false;
  bool reading_unicode_string = false;
  bool reading_comment = false;
  bool reading_multiline_comment = false;
  bool reading_high_nybble = true;
  bool reading_filename = false;
  bool big_endian = false;
  bool mask_enabled = true;
  string filename;
  while (in[0]) {
    bool read_nybble = 0;

    // if between // and a newline, don't write to output buffer
    if (reading_comment) {
      if (in[0] == '\n') {
        reading_comment = false;
      }
      in++;

      // if between /* and */, don't write to output buffer
    } else if (reading_multiline_comment) {
      if ((in[0] == '*') && (in[1] == '/')) {
        reading_multiline_comment = 0;
        in += 2;
      } else {
        in++;
      }

      // if between quotes, read bytes to output buffer, unescaping where needed
    } else if (reading_string) {
      if (in[0] == '\"') {
        reading_string = 0;
        in++;

      } else if (in[0] == '\\') { // unescape char after a backslash
        if (!in[1]) {
          return data;
        } else if (in[1] == 'n') {
          data += '\n';
        } else if (in[1] == 'r') {
          data += '\r';
        } else if (in[1] == 't') {
          data += '\t';
        } else if (in[1] == '\"') {
          data += '\"';
        } else if (in[1] == '\'') {
          data += '\'';
        } else {
          data += in[1];
        }
        add_mask_bits(mask, mask_enabled, 1);
        in += 2;

      } else {
        data += in[0];
        add_mask_bits(mask, mask_enabled, 1);
        in++;
      }

      // if between single quotes, word-expand bytes to output buffer, unescaping
    } else if (reading_unicode_string) {
      if (in[0] == '\'') {
        reading_unicode_string = 0;
        in++;

      } else if (in[0] == '\\') { // unescape char after a backslash
        int16_t value;
        if (!in[1]) {
          return data;
        } else if (in[1] == 'n') {
          value = '\n';
        } else if (in[1] == 'r') {
          value = '\r';
        } else if (in[1] == 't') {
          value = '\t';
        } else {
          value = in[1];
        }
        if (big_endian != host_big_endian) {
          value = bswap16(value);
        }
        data.append((const char*)&value, 2);
        add_mask_bits(mask, mask_enabled, 2);
        in += 2;

      } else {
        int16_t value = in[0];
        if (big_endian != host_big_endian) {
          value = bswap16(value);
        }
        data.append((const char*)&value, 2);
        add_mask_bits(mask, mask_enabled, 2);
        in++;
      }

      // if between <>, read a file name, then stick that file into the buffer
    } else if (reading_filename) {
      if (in[0] == '>') {
        // TODO: support <filename@offset:size> syntax
        reading_filename = 0;
        size_t pre_size = data.size();
        data += load_file(filename);
        add_mask_bits(mask, mask_enabled, data.size() - pre_size);

      } else {
        filename.append(1, in[0]);
      }
      in++;

      // ? inverts mask_enabled
    } else if (in[0] == '?') {
      mask_enabled = !mask_enabled;
      in++;

      // $ changes the endianness
    } else if (in[0] == '$') {
      big_endian = !big_endian;
      in++;

      // # signifies a decimal number
    } else if (in[0] == '#') { // 8-bit
      in++;
      if (in[0] == '#') { // 16-bit
        in++;
        if (in[0] == '#') { // 32-bit
          in++;
          if (in[0] == '#') { // 64-bit
            in++;
            uint64_t value = strtoull(in, const_cast<char**>(&in), 0);
            if (big_endian != host_big_endian) {
              value = bswap64(value);
            }
            data.append((const char*)&value, 8);
            add_mask_bits(mask, mask_enabled, 8);

          } else {
            uint32_t value = strtoull(in, const_cast<char**>(&in), 0);
            if (big_endian != host_big_endian) {
              value = bswap32(value);
            }
            data.append((const char*)&value, 4);
            add_mask_bits(mask, mask_enabled, 4);
          }

        } else {
          uint16_t value = strtoull(in, const_cast<char**>(&in), 0);
          if (big_endian != host_big_endian) {
            value = bswap16(value);
          }
          data.append((const char*)&value, 2);
          add_mask_bits(mask, mask_enabled, 2);
        }

      } else {
        data.append(1, (char)strtoull(in, const_cast<char**>(&in), 0));
        add_mask_bits(mask, mask_enabled, 1);
      }

      // % is a float, %% is a double
    } else if (in[0] == '%') {
      in++;
      if (in[0] == '%') {
        in++;

        uint64_t value;
        *(double*)&value = strtod(in, const_cast<char**>(&in));
        if (big_endian != host_big_endian) {
          value = bswap64(value);
        }
        data.append((const char*)&value, 8);
        add_mask_bits(mask, mask_enabled, 8);

      } else {
        uint32_t value;
        *(float*)&value = strtof(in, const_cast<char**>(&in));
        if (big_endian != host_big_endian) {
          value = bswap32(value);
        }
        data.append((const char*)&value, 4);
        add_mask_bits(mask, mask_enabled, 4);
      }

      // anything else is a hex digit
    } else {
      if ((in[0] >= '0') && (in[0] <= '9')) {
        read_nybble = true;
        chr |= (in[0] - '0');

      } else if ((in[0] >= 'A') && (in[0] <= 'F')) {
        read_nybble = true;
        chr |= (in[0] - 'A' + 0x0A);

      } else if ((in[0] >= 'a') && (in[0] <= 'f')) {
        read_nybble = true;
        chr |= (in[0] - 'a' + 0x0A);

      } else if (in[0] == '\"') {
        reading_string = true;

      } else if (in[0] == '\'') {
        reading_unicode_string = 1;

      } else if ((in[0] == '/') && (in[1] == '/')) {
        reading_comment = 1;

      } else if ((in[0] == '/') && (in[1] == '*')) {
        reading_multiline_comment = 1;

      } else if (in[0] == '<' && allow_files) {
        reading_filename = 1;
        filename.clear();
      }
      in++;
    }

    if (read_nybble) {
      if (reading_high_nybble) {
        chr = chr << 4;
      } else {
        data += (char)chr;
        add_mask_bits(mask, mask_enabled, 1);
        chr = 0;
      }
      reading_high_nybble = !reading_high_nybble;
    }
  }
  return data;
}